

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-to-double.cc
# Opt level: O3

double __thiscall
double_conversion::StringToDoubleConverter::StringToIeee<unsigned_short_const*>
          (StringToDoubleConverter *this,unsigned_short *input,int length,bool read_as_double,
          int *processed_characters_count)

{
  double dVar1;
  uc16 separator;
  uint uVar2;
  long lVar3;
  unsigned_short *puVar4;
  char cVar5;
  bool bVar6;
  bool bVar7;
  ulong uVar8;
  locale *plVar9;
  ushort uVar10;
  int iVar11;
  int iVar12;
  unsigned_short *start_00;
  ulong uVar13;
  ushort *puVar14;
  ushort uVar15;
  long lVar16;
  long lVar17;
  byte bVar18;
  byte bVar19;
  char *pcVar20;
  int iVar21;
  uint uVar22;
  long in_FS_OFFSET;
  bool sign;
  float fVar23;
  Vector<const_char> trimmed;
  Vector<const_char> trimmed_00;
  bool *in_stack_fffffffffffffc40;
  int local_38c;
  char *start;
  undefined1 local_359;
  unsigned_short *end;
  undefined8 local_350;
  char buffer [782];
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  end = input + length;
  *processed_characters_count = 0;
  local_350 = input;
  if (length != 0) {
    uVar2 = this->flags_;
    if ((uVar2 & 0x18) == 0) {
      uVar15 = *input;
      goto LAB_003e0aab;
    }
    do {
      uVar15 = *local_350;
      lVar16 = 0;
      if (uVar15 < 0x80) {
        while ((int)(char)(&kWhitespaceTable7)[lVar16] != (uint)uVar15) {
          lVar16 = lVar16 + 1;
          if (lVar16 == 6) goto LAB_003e0a86;
        }
      }
      else {
        while (*(ushort *)((long)&kWhitespaceTable16 + lVar16) != uVar15) {
          lVar16 = lVar16 + 2;
          if (lVar16 == 0x28) goto LAB_003e0a86;
        }
      }
      local_350 = local_350 + 1;
    } while (local_350 != end);
    *processed_characters_count = length;
  }
  dVar1 = this->empty_string_value_;
  local_350 = input;
  goto LAB_003e10e7;
LAB_003e0a86:
  if (local_350 == input || (char)((uVar2 & 8) >> 3) != '\0') {
LAB_003e0aab:
    if ((uVar15 != 0x2d) && (uVar15 != 0x2b)) {
      sign = false;
      goto LAB_003e0b73;
    }
    sign = uVar15 == 0x2d;
    if (local_350 + 1 != end) {
      lVar16 = 2;
      do {
        uVar15 = *(ushort *)((long)local_350 + lVar16);
        lVar17 = 0;
        if (uVar15 < 0x80) {
          while ((int)(char)(&kWhitespaceTable7)[lVar17] != (uint)uVar15) {
            lVar17 = lVar17 + 1;
            if (lVar17 == 6) goto LAB_003e0b32;
          }
        }
        else {
          while (*(ushort *)((long)&kWhitespaceTable16 + lVar17) != uVar15) {
            lVar17 = lVar17 + 2;
            if (lVar17 == 0x28) goto LAB_003e0b32;
          }
        }
        lVar17 = lVar16 + 2;
        lVar16 = lVar16 + 2;
      } while ((ushort *)((long)local_350 + lVar17) != end);
    }
  }
  goto LAB_003e10e1;
  while (iVar12 = iVar12 + -1, *local_350 == 0x30) {
LAB_003e11e0:
    in_stack_fffffffffffffc40 = (bool *)0x3e11f7;
    bVar7 = Advance<unsigned_short_const*>((unsigned_short **)&local_350,separator,10,&end);
    if (bVar7) {
      *processed_characters_count = (int)((ulong)((long)local_350 - (long)input) >> 1);
      goto joined_r0x003e0e06;
    }
  }
LAB_003e1210:
  do {
    uVar10 = *local_350;
    if (9 < (ushort)(uVar10 - 0x30)) goto LAB_003e0fe2;
    if (iVar21 < 0x304) {
      lVar16 = (long)(int)uVar22;
      uVar22 = uVar22 + 1;
      buffer[lVar16] = (char)uVar10;
      iVar21 = iVar21 + 1;
      iVar12 = iVar12 + -1;
    }
    else {
      bVar6 = (bool)(uVar10 != 0x30 | bVar6);
    }
    in_stack_fffffffffffffc40 = (bool *)0x3e1269;
    bVar7 = Advance<unsigned_short_const*>((unsigned_short **)&local_350,separator,10,&end);
  } while (!bVar7);
LAB_003e0d6b:
  if ((bVar19 & 1) == 0) {
    local_38c = local_38c + iVar12;
LAB_003e0f93:
    if (bVar6) {
      lVar16 = (long)(int)uVar22;
      uVar22 = uVar22 + 1;
      buffer[lVar16] = '1';
      local_38c = local_38c + -1;
    }
    buffer[(int)uVar22] = '\0';
    uVar8 = (ulong)uVar22;
    uVar13 = (ulong)(uVar22 + 1);
    do {
      if ((int)uVar8 < 1) {
        uVar13 = 0;
        break;
      }
      uVar13 = (ulong)((int)uVar13 - 1);
      lVar16 = uVar8 - 1;
      uVar8 = uVar8 - 1;
    } while (buffer[lVar16] == '0');
    local_38c = (uVar22 - (int)uVar13) + local_38c;
    if (read_as_double) {
      trimmed._8_8_ = uVar13;
      trimmed.start_ = buffer;
      dVar1 = StrtodTrimmed(trimmed,local_38c);
    }
    else {
      trimmed_00._8_8_ = uVar13;
      trimmed_00.start_ = buffer;
      fVar23 = StrtofTrimmed(trimmed_00,local_38c);
      dVar1 = (double)fVar23;
    }
    *processed_characters_count = (int)((ulong)((long)local_350 - (long)input) >> 1);
    if (sign != false) {
      dVar1 = -dVar1;
    }
    goto LAB_003e10e7;
  }
  start = buffer;
  dVar1 = RadixStringToIeee<3,char*>
                    (&start,buffer + (int)uVar22,sign,separator,SUB41((uVar2 & 4) >> 2,0),
                     read_as_double,this->junk_string_value_,SUB81(&local_359,0),
                     in_stack_fffffffffffffc40);
  uVar8 = (long)local_350 - (long)input;
LAB_003e0dcb:
  *processed_characters_count = (int)(uVar8 >> 1);
  goto LAB_003e10e7;
LAB_003e0fe2:
  if ((iVar21 != 0 || iVar12 != 0) || uVar15 == 0x30) {
    if ((uVar10 | 0x20) == 0x65) {
      if (((~bVar19 | (byte)uVar2 >> 2) & 1) != 0) {
        if ((bVar19 & 1) != 0) goto LAB_003e0d6b;
        puVar14 = local_350 + 1;
        if (puVar14 != end) {
          uVar15 = *puVar14;
          if ((uVar15 == 0x2d) || (cVar5 = '+', uVar15 == 0x2b)) {
            puVar14 = local_350 + 2;
            cVar5 = (char)uVar15;
            if (puVar14 == end) goto joined_r0x003e12b9;
          }
          if ((puVar14 != end) && (uVar15 = *puVar14, 0xfff5 < (ushort)(uVar15 - 0x3a))) {
            iVar21 = 0;
            do {
              puVar14 = puVar14 + 1;
              if ((iVar21 < 0x6666666) ||
                 ((iVar11 = 0x3fffffff, iVar21 == 0x6666666 && (uVar15 < 0x34)))) {
                iVar11 = (uint)uVar15 + iVar21 * 10 + -0x30;
              }
              iVar21 = iVar11;
            } while ((puVar14 != end) && (uVar15 = *puVar14, (ushort)(uVar15 - 0x30) < 10));
            iVar11 = -iVar21;
            if (cVar5 != '-') {
              iVar11 = iVar21;
            }
            iVar12 = iVar12 + iVar11;
            local_350 = puVar14;
            goto LAB_003e1180;
          }
        }
joined_r0x003e12b9:
        if ((uVar2 & 4) != 0) goto LAB_003e0d6b;
      }
    }
    else {
LAB_003e1180:
      if ((uVar2 & 0x14) != 0) {
        if ((uVar2 & 4) == 0) {
LAB_003e12d0:
          in_stack_fffffffffffffc40 = (bool *)0x3e12dd;
          bVar7 = AdvanceToNonspace<unsigned_short_const*>((unsigned_short **)&local_350,end);
          if (bVar7) goto LAB_003e12e4;
        }
        if ((uVar2 & 0x10) != 0) {
          in_stack_fffffffffffffc40 = (bool *)0x3e1317;
          AdvanceToNonspace<unsigned_short_const*>((unsigned_short **)&local_350,end);
        }
        goto LAB_003e0d6b;
      }
      if (local_350 == end) goto LAB_003e12d0;
    }
  }
LAB_003e12e4:
  dVar1 = this->junk_string_value_;
  goto LAB_003e10e7;
LAB_003e0b32:
  if (lVar16 == 2 || (char)((uVar2 & 0x20) >> 5) != '\0') {
    local_350 = (ushort *)((long)local_350 + lVar16);
LAB_003e0b73:
    pcVar20 = this->infinity_symbol_;
    cVar5 = (char)uVar15;
    if (pcVar20 == (char *)0x0) {
      pcVar20 = this->nan_symbol_;
      if (pcVar20 != (char *)0x0) {
        if ((uVar2 & 0x40) == 0) {
LAB_003e0c1f:
          if (*pcVar20 == cVar5) goto LAB_003e0c6d;
        }
        else {
LAB_003e0c3e:
          if (((anonymous_namespace)::ToLower(char)::cType == '\0') &&
             (iVar21 = __cxa_guard_acquire(&(anonymous_namespace)::ToLower(char)::cType),
             iVar21 != 0)) {
            plVar9 = (locale *)std::locale::classic();
            (anonymous_namespace)::ToLower(char)::cType = std::use_facet<std::ctype<char>>(plVar9);
            __cxa_guard_release(&(anonymous_namespace)::ToLower(char)::cType);
          }
          in_stack_fffffffffffffc40 = (bool *)0x3e0c5c;
          cVar5 = (**(code **)(*(long *)(anonymous_namespace)::ToLower(char)::cType + 0x20))
                            ((anonymous_namespace)::ToLower(char)::cType,(int)cVar5);
          if (cVar5 == *pcVar20) {
            pcVar20 = this->nan_symbol_;
LAB_003e0c6d:
            puVar4 = end;
            bVar6 = (anonymous_namespace)::ConsumeSubString<unsigned_short_const*>
                              ((unsigned_short **)&local_350,end,pcVar20,
                               SUB41((uVar2 & 0x40) >> 6,0));
            if (bVar6) {
              if ((uVar2 & 0x14) != 0) {
                if ((uVar2 & 4) == 0) goto LAB_003e10d0;
LAB_003e1110:
                *processed_characters_count = (int)((ulong)((long)local_350 - (long)input) >> 1);
                if (sign == false) {
                  dVar1 = NAN;
                }
                else {
                  dVar1 = -NAN;
                }
                goto LAB_003e10e7;
              }
              if (local_350 == puVar4) {
LAB_003e10d0:
                bVar6 = AdvanceToNonspace<unsigned_short_const*>
                                  ((unsigned_short **)&local_350,puVar4);
                if (!bVar6) goto LAB_003e1110;
              }
            }
            goto LAB_003e10e1;
          }
        }
      }
    }
    else if ((uVar2 & 0x40) == 0) {
      if (*pcVar20 == cVar5) goto LAB_003e0bd4;
      pcVar20 = this->nan_symbol_;
      if (pcVar20 != (char *)0x0) goto LAB_003e0c1f;
    }
    else {
      if (((anonymous_namespace)::ToLower(char)::cType == '\0') &&
         (iVar21 = __cxa_guard_acquire(&(anonymous_namespace)::ToLower(char)::cType), iVar21 != 0))
      {
        plVar9 = (locale *)std::locale::classic();
        (anonymous_namespace)::ToLower(char)::cType = std::use_facet<std::ctype<char>>(plVar9);
        __cxa_guard_release(&(anonymous_namespace)::ToLower(char)::cType);
      }
      in_stack_fffffffffffffc40 = (bool *)0x3e0ba0;
      cVar5 = (**(code **)(*(long *)(anonymous_namespace)::ToLower(char)::cType + 0x20))
                        ((anonymous_namespace)::ToLower(char)::cType,(int)cVar5);
      if (cVar5 == *pcVar20) {
        pcVar20 = this->infinity_symbol_;
LAB_003e0bd4:
        puVar4 = end;
        bVar6 = (anonymous_namespace)::ConsumeSubString<unsigned_short_const*>
                          ((unsigned_short **)&local_350,end,pcVar20,SUB41((uVar2 & 0x40) >> 6,0));
        if (bVar6) {
          if ((uVar2 & 0x14) != 0) {
            if ((uVar2 & 4) == 0) goto LAB_003e104b;
LAB_003e1060:
            *processed_characters_count = (int)((ulong)((long)local_350 - (long)input) >> 1);
            if (sign == false) {
              dVar1 = INFINITY;
            }
            else {
              dVar1 = -INFINITY;
            }
            goto LAB_003e10e7;
          }
          if (local_350 == puVar4) {
LAB_003e104b:
            bVar6 = AdvanceToNonspace<unsigned_short_const*>((unsigned_short **)&local_350,puVar4);
            if (!bVar6) goto LAB_003e1060;
          }
        }
        goto LAB_003e10e1;
      }
      pcVar20 = this->nan_symbol_;
      if (pcVar20 != (char *)0x0) {
        cVar5 = (char)*local_350;
        goto LAB_003e0c3e;
      }
    }
    uVar15 = *local_350;
    separator = this->separator_;
    bVar18 = 0;
    if (uVar15 != 0x30) {
LAB_003e0ccf:
      uVar22 = 0;
      bVar6 = false;
      local_38c = 0;
      iVar21 = 0;
      do {
        uVar10 = *local_350;
        if (9 < (ushort)(uVar10 - 0x30)) {
          bVar19 = bVar18;
          if (iVar21 == 0) {
            bVar19 = 0;
          }
          iVar12 = 0;
          if (uVar10 != 0x2e) goto LAB_003e0fe2;
          if (((~bVar19 | (byte)uVar2 >> 2) & 1) == 0) goto LAB_003e12e4;
          iVar12 = 0;
          if ((bVar19 & 1) != 0) goto LAB_003e0d6b;
          in_stack_fffffffffffffc40 = (bool *)0x3e1151;
          bVar7 = Advance<unsigned_short_const*>((unsigned_short **)&local_350,separator,10,&end);
          if (bVar7) {
            iVar12 = 0;
            bVar19 = bVar18;
            if (iVar21 != 0) goto LAB_003e0d6b;
            if (uVar15 != 0x30) goto LAB_003e12e4;
            goto LAB_003e0f93;
          }
          iVar12 = 0;
          if ((iVar21 != 0) || (*local_350 != 0x30)) goto LAB_003e1210;
          iVar12 = 0;
          goto LAB_003e11e0;
        }
        if (iVar21 < 0x304) {
          lVar16 = (long)(int)uVar22;
          uVar22 = uVar22 + 1;
          buffer[lVar16] = (char)uVar10;
          iVar21 = iVar21 + 1;
        }
        else {
          local_38c = local_38c + 1;
          bVar6 = (bool)(uVar10 != 0x30 | bVar6);
        }
        bVar18 = bVar18 & uVar10 < 0x38;
        in_stack_fffffffffffffc40 = (bool *)0x3e0d60;
        bVar7 = Advance<unsigned_short_const*>((unsigned_short **)&local_350,separator,10,&end);
      } while (!bVar7);
      iVar12 = 0;
      bVar19 = bVar18;
      goto LAB_003e0d6b;
    }
    in_stack_fffffffffffffc40 = (bool *)0x3e0ded;
    bVar6 = Advance<unsigned_short_const*>((unsigned_short **)&local_350,separator,10,&end);
    puVar4 = end;
    if (!bVar6) {
      bVar18 = (byte)this->flags_;
      if (((this->flags_ & 0x81U) != 0) && ((*local_350 | 0x20) == 0x78)) {
        start_00 = local_350 + 1;
        local_350 = start_00;
        if (start_00 == end) goto LAB_003e10e1;
        if ((char)bVar18 < '\0') {
          bVar6 = IsHexFloatString<unsigned_short_const*>
                            (start_00,end,separator,SUB41((uVar2 & 4) >> 2,0));
          bVar7 = true;
          if (!bVar6) goto LAB_003e0ec2;
        }
        else {
LAB_003e0ec2:
          uVar15 = *start_00;
          if ((0x3f < uVar15 || 9 < uVar15 - 0x30) &&
             ((uVar22 = uVar15 - 0x41, 0x25 < (ushort)uVar22 ||
              ((0x3f0000003fU >> ((ulong)(uVar22 & 0xffff) & 0x3f) & 1) == 0)))) goto LAB_003e10e1;
          bVar7 = false;
        }
        buffer[0] = -0x56;
        dVar1 = RadixStringToIeee<4,unsigned_short_const*>
                          ((unsigned_short **)&local_350,puVar4,sign,this->separator_,bVar7,
                           SUB41((uVar2 & 4) >> 2,0),this->junk_string_value_,read_as_double,
                           (bool *)buffer);
        if (buffer[0] != '\0') goto LAB_003e10e7;
        if ((uVar2 & 0x10) != 0) {
          AdvanceToNonspace<unsigned_short_const*>((unsigned_short **)&local_350,puVar4);
        }
        uVar8 = (long)local_350 - (long)input;
        goto LAB_003e0dcb;
      }
      do {
        if (*local_350 != 0x30) {
          bVar18 = bVar18 >> 1;
          goto LAB_003e0ccf;
        }
        in_stack_fffffffffffffc40 = (bool *)0x3e0f6a;
        bVar6 = Advance<unsigned_short_const*>((unsigned_short **)&local_350,separator,10,&end);
      } while (!bVar6);
    }
    *processed_characters_count = (int)((ulong)((long)local_350 - (long)input) >> 1);
joined_r0x003e0e06:
    if (sign == false) {
      dVar1 = 0.0;
    }
    else {
      dVar1 = -0.0;
    }
    goto LAB_003e10e7;
  }
LAB_003e10e1:
  dVar1 = this->junk_string_value_;
LAB_003e10e7:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return dVar1;
  }
  __stack_chk_fail();
}

Assistant:

double StringToDoubleConverter::StringToIeee(
    Iterator input,
    int length,
    bool read_as_double,
    int* processed_characters_count) const {
  Iterator current = input;
  Iterator end = input + length;

  *processed_characters_count = 0;

  const bool allow_trailing_junk = (flags_ & ALLOW_TRAILING_JUNK) != 0;
  const bool allow_leading_spaces = (flags_ & ALLOW_LEADING_SPACES) != 0;
  const bool allow_trailing_spaces = (flags_ & ALLOW_TRAILING_SPACES) != 0;
  const bool allow_spaces_after_sign = (flags_ & ALLOW_SPACES_AFTER_SIGN) != 0;
  const bool allow_case_insensitivity = (flags_ & ALLOW_CASE_INSENSITIVITY) != 0;

  // To make sure that iterator dereferencing is valid the following
  // convention is used:
  // 1. Each '++current' statement is followed by check for equality to 'end'.
  // 2. If AdvanceToNonspace returned false then current == end.
  // 3. If 'current' becomes equal to 'end' the function returns or goes to
  // 'parsing_done'.
  // 4. 'current' is not dereferenced after the 'parsing_done' label.
  // 5. Code before 'parsing_done' may rely on 'current != end'.
  if (current == end) return empty_string_value_;

  if (allow_leading_spaces || allow_trailing_spaces) {
    if (!AdvanceToNonspace(&current, end)) {
      *processed_characters_count = static_cast<int>(current - input);
      return empty_string_value_;
    }
    if (!allow_leading_spaces && (input != current)) {
      // No leading spaces allowed, but AdvanceToNonspace moved forward.
      return junk_string_value_;
    }
  }

  // Exponent will be adjusted if insignificant digits of the integer part
  // or insignificant leading zeros of the fractional part are dropped.
  int exponent = 0;
  int significant_digits = 0;
  int insignificant_digits = 0;
  bool nonzero_digit_dropped = false;

  bool sign = false;

  if (*current == '+' || *current == '-') {
    sign = (*current == '-');
    ++current;
    Iterator next_non_space = current;
    // Skip following spaces (if allowed).
    if (!AdvanceToNonspace(&next_non_space, end)) return junk_string_value_;
    if (!allow_spaces_after_sign && (current != next_non_space)) {
      return junk_string_value_;
    }
    current = next_non_space;
  }

  if (infinity_symbol_ != DOUBLE_CONVERSION_NULLPTR) {
    if (ConsumeFirstCharacter(*current, infinity_symbol_, allow_case_insensitivity)) {
      if (!ConsumeSubString(&current, end, infinity_symbol_, allow_case_insensitivity)) {
        return junk_string_value_;
      }

      if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
        return junk_string_value_;
      }
      if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
        return junk_string_value_;
      }

      *processed_characters_count = static_cast<int>(current - input);
      return sign ? -Double::Infinity() : Double::Infinity();
    }
  }

  if (nan_symbol_ != DOUBLE_CONVERSION_NULLPTR) {
    if (ConsumeFirstCharacter(*current, nan_symbol_, allow_case_insensitivity)) {
      if (!ConsumeSubString(&current, end, nan_symbol_, allow_case_insensitivity)) {
        return junk_string_value_;
      }

      if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
        return junk_string_value_;
      }
      if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
        return junk_string_value_;
      }

      *processed_characters_count = static_cast<int>(current - input);
      return sign ? -Double::NaN() : Double::NaN();
    }
  }

  bool leading_zero = false;
  if (*current == '0') {
    if (Advance(&current, separator_, 10, end)) {
      *processed_characters_count = static_cast<int>(current - input);
      return SignedZero(sign);
    }

    leading_zero = true;

    // It could be hexadecimal value.
    if (((flags_ & ALLOW_HEX) || (flags_ & ALLOW_HEX_FLOATS)) &&
        (*current == 'x' || *current == 'X')) {
      ++current;

      if (current == end) return junk_string_value_;  // "0x"

      bool parse_as_hex_float = (flags_ & ALLOW_HEX_FLOATS) &&
                IsHexFloatString(current, end, separator_, allow_trailing_junk);

      if (!parse_as_hex_float && !isDigit(*current, 16)) {
        return junk_string_value_;
      }

      bool result_is_junk;
      double result = RadixStringToIeee<4>(&current,
                                           end,
                                           sign,
                                           separator_,
                                           parse_as_hex_float,
                                           allow_trailing_junk,
                                           junk_string_value_,
                                           read_as_double,
                                           &result_is_junk);
      if (!result_is_junk) {
        if (allow_trailing_spaces) AdvanceToNonspace(&current, end);
        *processed_characters_count = static_cast<int>(current - input);
      }
      return result;
    }

    // Ignore leading zeros in the integer part.
    while (*current == '0') {
      if (Advance(&current, separator_, 10, end)) {
        *processed_characters_count = static_cast<int>(current - input);
        return SignedZero(sign);
      }
    }
  }

  bool octal = leading_zero && (flags_ & ALLOW_OCTALS) != 0;

  // The longest form of simplified number is: "-<significant digits>.1eXXX\0".
  const int kBufferSize = kMaxSignificantDigits + 10;
  DOUBLE_CONVERSION_STACK_UNINITIALIZED char
      buffer[kBufferSize];  // NOLINT: size is known at compile time.
  int buffer_pos = 0;

  // Copy significant digits of the integer part (if any) to the buffer.
  while (*current >= '0' && *current <= '9') {
    if (significant_digits < kMaxSignificantDigits) {
      DOUBLE_CONVERSION_ASSERT(buffer_pos < kBufferSize);
      buffer[buffer_pos++] = static_cast<char>(*current);
      significant_digits++;
      // Will later check if it's an octal in the buffer.
    } else {
      insignificant_digits++;  // Move the digit into the exponential part.
      nonzero_digit_dropped = nonzero_digit_dropped || *current != '0';
    }
    octal = octal && *current < '8';
    if (Advance(&current, separator_, 10, end)) goto parsing_done;
  }

  if (significant_digits == 0) {
    octal = false;
  }

  if (*current == '.') {
    if (octal && !allow_trailing_junk) return junk_string_value_;
    if (octal) goto parsing_done;

    if (Advance(&current, separator_, 10, end)) {
      if (significant_digits == 0 && !leading_zero) {
        return junk_string_value_;
      } else {
        goto parsing_done;
      }
    }

    if (significant_digits == 0) {
      // octal = false;
      // Integer part consists of 0 or is absent. Significant digits start after
      // leading zeros (if any).
      while (*current == '0') {
        if (Advance(&current, separator_, 10, end)) {
          *processed_characters_count = static_cast<int>(current - input);
          return SignedZero(sign);
        }
        exponent--;  // Move this 0 into the exponent.
      }
    }

    // There is a fractional part.
    // We don't emit a '.', but adjust the exponent instead.
    while (*current >= '0' && *current <= '9') {
      if (significant_digits < kMaxSignificantDigits) {
        DOUBLE_CONVERSION_ASSERT(buffer_pos < kBufferSize);
        buffer[buffer_pos++] = static_cast<char>(*current);
        significant_digits++;
        exponent--;
      } else {
        // Ignore insignificant digits in the fractional part.
        nonzero_digit_dropped = nonzero_digit_dropped || *current != '0';
      }
      if (Advance(&current, separator_, 10, end)) goto parsing_done;
    }
  }

  if (!leading_zero && exponent == 0 && significant_digits == 0) {
    // If leading_zeros is true then the string contains zeros.
    // If exponent < 0 then string was [+-]\.0*...
    // If significant_digits != 0 the string is not equal to 0.
    // Otherwise there are no digits in the string.
    return junk_string_value_;
  }

  // Parse exponential part.
  if (*current == 'e' || *current == 'E') {
    if (octal && !allow_trailing_junk) return junk_string_value_;
    if (octal) goto parsing_done;
    Iterator junk_begin = current;
    ++current;
    if (current == end) {
      if (allow_trailing_junk) {
        current = junk_begin;
        goto parsing_done;
      } else {
        return junk_string_value_;
      }
    }
    char exponen_sign = '+';
    if (*current == '+' || *current == '-') {
      exponen_sign = static_cast<char>(*current);
      ++current;
      if (current == end) {
        if (allow_trailing_junk) {
          current = junk_begin;
          goto parsing_done;
        } else {
          return junk_string_value_;
        }
      }
    }

    if (current == end || *current < '0' || *current > '9') {
      if (allow_trailing_junk) {
        current = junk_begin;
        goto parsing_done;
      } else {
        return junk_string_value_;
      }
    }

    const int max_exponent = INT_MAX / 2;
    DOUBLE_CONVERSION_ASSERT(-max_exponent / 2 <= exponent && exponent <= max_exponent / 2);
    int num = 0;
    do {
      // Check overflow.
      int digit = *current - '0';
      if (num >= max_exponent / 10
          && !(num == max_exponent / 10 && digit <= max_exponent % 10)) {
        num = max_exponent;
      } else {
        num = num * 10 + digit;
      }
      ++current;
    } while (current != end && *current >= '0' && *current <= '9');

    exponent += (exponen_sign == '-' ? -num : num);
  }

  if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
    return junk_string_value_;
  }
  if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
    return junk_string_value_;
  }
  if (allow_trailing_spaces) {
    AdvanceToNonspace(&current, end);
  }

  parsing_done:
  exponent += insignificant_digits;

  if (octal) {
    double result;
    bool result_is_junk;
    char* start = buffer;
    result = RadixStringToIeee<3>(&start,
                                  buffer + buffer_pos,
                                  sign,
                                  separator_,
                                  false, // Don't parse as hex_float.
                                  allow_trailing_junk,
                                  junk_string_value_,
                                  read_as_double,
                                  &result_is_junk);
    DOUBLE_CONVERSION_ASSERT(!result_is_junk);
    *processed_characters_count = static_cast<int>(current - input);
    return result;
  }

  if (nonzero_digit_dropped) {
    buffer[buffer_pos++] = '1';
    exponent--;
  }

  DOUBLE_CONVERSION_ASSERT(buffer_pos < kBufferSize);
  buffer[buffer_pos] = '\0';

  // Code above ensures there are no leading zeros and the buffer has fewer than
  // kMaxSignificantDecimalDigits characters. Trim trailing zeros.
  Vector<const char> chars(buffer, buffer_pos);
  chars = TrimTrailingZeros(chars);
  exponent += buffer_pos - chars.length();

  double converted;
  if (read_as_double) {
    converted = StrtodTrimmed(chars, exponent);
  } else {
    converted = StrtofTrimmed(chars, exponent);
  }
  *processed_characters_count = static_cast<int>(current - input);
  return sign? -converted: converted;
}